

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

TString * luaS_newextlstr(lua_State *L,char *s,size_t len,lua_Alloc falloc,void *ud)

{
  TStatus TVar1;
  NewExt ne;
  
  if (len < 0x29) {
    ne.s = s;
    ne.len = len;
    if (falloc == (lua_Alloc)0x0) {
      f_pintern(L,&ne);
    }
    else {
      TVar1 = luaD_rawrunprotected(L,f_pintern,&ne);
      (*falloc)(ud,s,len + 1,0);
      if (TVar1 != '\0') {
LAB_001159d5:
        luaD_throw(L,'\x04');
      }
    }
  }
  else {
    if (falloc == (lua_Alloc)0x0) {
      ne.kind = -2;
      f_newext(L,&ne);
    }
    else {
      ne.kind = -3;
      TVar1 = luaD_rawrunprotected(L,f_newext,&ne);
      if (TVar1 != '\0') {
        (*falloc)(ud,s,len + 1,0);
        goto LAB_001159d5;
      }
      (ne.ts)->falloc = falloc;
      (ne.ts)->ud = ud;
    }
    (ne.ts)->shrlen = ne.kind;
    ((ne.ts)->u).lnglen = len;
    (ne.ts)->contents = s;
  }
  return ne.ts;
}

Assistant:

TString *luaS_newextlstr (lua_State *L,
	          const char *s, size_t len, lua_Alloc falloc, void *ud) {
  struct NewExt ne;
  if (len <= LUAI_MAXSHORTLEN) {  /* short string? */
    ne.s = s; ne.len = len;
    if (!falloc)
      f_pintern(L, &ne);  /* just internalize string */
    else {
      TStatus status = luaD_rawrunprotected(L, f_pintern, &ne);
      (*falloc)(ud, cast_voidp(s), len + 1, 0);  /* free external string */
      if (status != LUA_OK)  /* memory error? */
        luaM_error(L);  /* re-raise memory error */
    }
    return ne.ts;
  }
  /* "normal" case: long strings */
  if (!falloc) {
    ne.kind = LSTRFIX;
    f_newext(L, &ne);  /* just create header */
  }
  else {
    ne.kind = LSTRMEM;
    if (luaD_rawrunprotected(L, f_newext, &ne) != LUA_OK) {  /* mem. error? */
      (*falloc)(ud, cast_voidp(s), len + 1, 0);  /* free external string */
      luaM_error(L);  /* re-raise memory error */
    }
    ne.ts->falloc = falloc;
    ne.ts->ud = ud;
  }
  ne.ts->shrlen = ne.kind;
  ne.ts->u.lnglen = len;
  ne.ts->contents = cast_charp(s);
  return ne.ts;
}